

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  bool bVar1;
  uchar *puVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  uchar *local_60;
  uchar *p;
  int spaces_present;
  uint equals;
  uint accumulated_digits;
  uint32_t x;
  size_t n;
  size_t i;
  size_t slen_local;
  uchar *src_local;
  size_t *olen_local;
  size_t dlen_local;
  uchar *dst_local;
  
  spaces_present = 0;
  p._4_4_ = 0;
  _accumulated_digits = 0;
  for (n = 0; n < slen; n = n + 1) {
    bVar1 = false;
    while( true ) {
      bVar5 = false;
      if (n < slen) {
        bVar5 = src[n] == ' ';
      }
      if (!bVar5) break;
      n = n + 1;
      bVar1 = true;
    }
    if (n == slen) break;
    if ((((slen - n < 2) || (src[n] != '\r')) || (src[n + 1] != '\n')) && (src[n] != '\n')) {
      if (bVar1) {
        return -0x2c;
      }
      if (0x7f < src[n]) {
        return -0x2c;
      }
      if (src[n] == '=') {
        p._4_4_ = p._4_4_ + 1;
        if (2 < p._4_4_) {
          return -0x2c;
        }
      }
      else {
        if (p._4_4_ != 0) {
          return -0x2c;
        }
        cVar3 = mbedtls_ct_base64_dec_value(src[n]);
        if (cVar3 < '\0') {
          return -0x2c;
        }
      }
      _accumulated_digits = _accumulated_digits + 1;
    }
  }
  if (_accumulated_digits == 0) {
    *olen = 0;
    dst_local._4_4_ = 0;
  }
  else {
    uVar4 = ((_accumulated_digits >> 3) * 6 + ((_accumulated_digits & 7) * 6 + 7 >> 3)) -
            (ulong)p._4_4_;
    if ((dst == (uchar *)0x0) || (dlen < uVar4)) {
      *olen = uVar4;
      dst_local._4_4_ = -0x2a;
    }
    else {
      p._4_4_ = 0;
      equals = 0;
      local_60 = dst;
      slen_local = (size_t)src;
      for (; n != 0; n = n - 1) {
        if (((*(char *)slen_local != '\r') && (*(char *)slen_local != '\n')) &&
           (*(char *)slen_local != ' ')) {
          equals = equals << 6;
          if (*(char *)slen_local == '=') {
            p._4_4_ = p._4_4_ + 1;
          }
          else {
            cVar3 = mbedtls_ct_base64_dec_value(*(uchar *)slen_local);
            equals = (int)cVar3 | equals;
          }
          spaces_present = spaces_present + 1;
          if (spaces_present == 4) {
            spaces_present = 0;
            *local_60 = (uchar)(equals >> 0x10);
            puVar2 = local_60 + 1;
            if (p._4_4_ < 2) {
              local_60[1] = (uchar)(equals >> 8);
              puVar2 = local_60 + 2;
            }
            local_60 = puVar2;
            if (p._4_4_ == 0) {
              *local_60 = (uchar)equals;
              local_60 = local_60 + 1;
            }
          }
        }
        slen_local = slen_local + 1;
      }
      *olen = (long)local_60 - (long)dst;
      dst_local._4_4_ = 0;
    }
  }
  return dst_local._4_4_;
}

Assistant:

int mbedtls_base64_decode(unsigned char *dst, size_t dlen, size_t *olen,
                          const unsigned char *src, size_t slen)
{
    size_t i; /* index in source */
    size_t n; /* number of digits or trailing = in source */
    uint32_t x; /* value accumulator */
    unsigned accumulated_digits = 0;
    unsigned equals = 0;
    int spaces_present = 0;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for (i = n = 0; i < slen; i++) {
        /* Skip spaces before checking for EOL */
        spaces_present = 0;
        while (i < slen && src[i] == ' ') {
            ++i;
            spaces_present = 1;
        }

        /* Spaces at end of buffer are OK */
        if (i == slen) {
            break;
        }

        if ((slen - i) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n') {
            continue;
        }

        if (src[i] == '\n') {
            continue;
        }

        /* Space inside a line is an error */
        if (spaces_present) {
            return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
        }

        if (src[i] > 127) {
            return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
        }

        if (src[i] == '=') {
            if (++equals > 2) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
        } else {
            if (equals != 0) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
            if (mbedtls_ct_base64_dec_value(src[i]) < 0) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
        }
        n++;
    }

    if (n == 0) {
        *olen = 0;
        return 0;
    }

    /* The following expression is to calculate the following formula without
     * risk of integer overflow in n:
     *     n = ( ( n * 6 ) + 7 ) >> 3;
     */
    n = (6 * (n >> 3)) + ((6 * (n & 0x7) + 7) >> 3);
    n -= equals;

    if (dst == NULL || dlen < n) {
        *olen = n;
        return MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL;
    }

    equals = 0;
    for (x = 0, p = dst; i > 0; i--, src++) {
        if (*src == '\r' || *src == '\n' || *src == ' ') {
            continue;
        }

        x = x << 6;
        if (*src == '=') {
            ++equals;
        } else {
            x |= mbedtls_ct_base64_dec_value(*src);
        }

        if (++accumulated_digits == 4) {
            accumulated_digits = 0;
            *p++ = MBEDTLS_BYTE_2(x);
            if (equals <= 1) {
                *p++ = MBEDTLS_BYTE_1(x);
            }
            if (equals <= 0) {
                *p++ = MBEDTLS_BYTE_0(x);
            }
        }
    }

    *olen = p - dst;

    return 0;
}